

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5CreateTable(Fts5Config *pConfig,char *zPost,char *zDefn,int bWithout,char **pzErr)

{
  char *pcVar1;
  char *local_40;
  char *zErr;
  char **ppcStack_30;
  int rc;
  char **pzErr_local;
  char *pcStack_20;
  int bWithout_local;
  char *zDefn_local;
  char *zPost_local;
  Fts5Config *pConfig_local;
  
  local_40 = (char *)0x0;
  pcVar1 = "";
  if (bWithout != 0) {
    pcVar1 = " WITHOUT ROWID";
  }
  ppcStack_30 = pzErr;
  pzErr_local._4_4_ = bWithout;
  pcStack_20 = zDefn;
  zDefn_local = zPost;
  zPost_local = (char *)pConfig;
  zErr._4_4_ = fts5ExecPrintf(pConfig->db,&local_40,"CREATE TABLE %Q.\'%q_%q\'(%s)%s",pConfig->zDb,
                              pConfig->zName,zPost,zDefn,pcVar1);
  if (local_40 != (char *)0x0) {
    pcVar1 = sqlite3_mprintf("fts5: error creating shadow table %q_%s: %s",
                             *(undefined8 *)(zPost_local + 0x10),zDefn_local,local_40);
    *ppcStack_30 = pcVar1;
    sqlite3_free(local_40);
  }
  return zErr._4_4_;
}

Assistant:

static int sqlite3Fts5CreateTable(
  Fts5Config *pConfig,            /* FTS5 configuration */
  const char *zPost,              /* Shadow table to create (e.g. "content") */
  const char *zDefn,              /* Columns etc. for shadow table */
  int bWithout,                   /* True for without rowid */
  char **pzErr                    /* OUT: Error message */
){
  int rc;
  char *zErr = 0;

  rc = fts5ExecPrintf(pConfig->db, &zErr, "CREATE TABLE %Q.'%q_%q'(%s)%s",
      pConfig->zDb, pConfig->zName, zPost, zDefn, 
#ifndef SQLITE_FTS5_NO_WITHOUT_ROWID
      bWithout?" WITHOUT ROWID":
#endif
      ""
  );
  if( zErr ){
    *pzErr = sqlite3_mprintf(
        "fts5: error creating shadow table %q_%s: %s", 
        pConfig->zName, zPost, zErr
    );
    sqlite3_free(zErr);
  }

  return rc;
}